

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2builder.cc
# Opt level: O0

bool __thiscall
S2Builder::EdgeChainSimplifier::InteriorVertexMatcher::Matches(InteriorVertexMatcher *this)

{
  bool local_21;
  bool local_11;
  InteriorVertexMatcher *this_local;
  
  local_11 = false;
  if ((((this->too_many_endpoints_ & 1U) == 0) && (local_11 = false, this->excess_out_ == 0)) &&
     (local_11 = false, this->n1_ == this->n2_)) {
    local_21 = true;
    if (this->n0_ != 0) {
      local_21 = 0 < this->n1_;
    }
    local_11 = local_21;
  }
  return local_11;
}

Assistant:

bool Matches() const {
    // We check that there are the same number of incoming and outgoing edges
    // in each direction by verifying that (1) indegree(v0) == outdegree(v0)
    // and (2) the total number of edges (incoming and outgoing) to "v1" and
    // "v2" are equal.  We also check the condition on degenerate edges that
    // is documented above.
    return (!too_many_endpoints_ && excess_out_ == 0 && n1_ == n2_ &&
            (n0_ == 0 || n1_ > 0));
  }